

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
DynamicInitializationTemplateExpander::DynamicInitializationTemplateExpander
          (DynamicInitializationTemplateExpander *this)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  Template *pTVar7;
  allocator local_209;
  string local_208 [32];
  TemplateString local_1e8;
  TemplateString local_1c8;
  allocator local_1a1;
  string local_1a0 [32];
  TemplateString local_180;
  TemplateString local_160;
  allocator local_139;
  string local_138 [32];
  TemplateString local_118;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateDictionary local_a8 [8];
  TemplateDictionary dict;
  TemplateString local_38;
  Template *local_18;
  Template *tpl;
  DynamicInitializationTemplateExpander *this_local;
  
  tpl = (Template *)this;
  ctemplate::TemplateString::TemplateString(&local_38,"hi {{VAR}} lo");
  local_18 = (Template *)ctemplate::Template::StringToTemplate(&local_38,STRIP_WHITESPACE);
  ctemplate::TemplateString::TemplateString(&local_c8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_a8,&local_c8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_e8,"VAR");
  ctemplate::TemplateString::TemplateString(&local_118,"short-lived",5);
  TVar1.length_ = local_e8.length_;
  TVar1.ptr_ = local_e8.ptr_;
  TVar1.is_immutable_ = local_e8.is_immutable_;
  TVar1._17_7_ = local_e8._17_7_;
  TVar1.id_ = local_e8.id_;
  TVar4.length_ = local_118.length_;
  TVar4.ptr_ = local_118.ptr_;
  TVar4.is_immutable_ = local_118.is_immutable_;
  TVar4._17_7_ = local_118._17_7_;
  TVar4.id_ = local_118.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar4);
  pTVar7 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"hi short lo",&local_139);
  ctemplate::AssertExpandIs(pTVar7,local_a8,(string *)local_138,true);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  ctemplate::TemplateString::TemplateString(&local_160,"VAR");
  ctemplate::TemplateString::TemplateString(&local_180,&kHello);
  TVar2.length_ = local_160.length_;
  TVar2.ptr_ = local_160.ptr_;
  TVar2.is_immutable_ = local_160.is_immutable_;
  TVar2._17_7_ = local_160._17_7_;
  TVar2.id_ = local_160.id_;
  TVar5.length_ = local_180.length_;
  TVar5.ptr_ = local_180.ptr_;
  TVar5.is_immutable_ = local_180.is_immutable_;
  TVar5._17_7_ = local_180._17_7_;
  TVar5.id_ = local_180.id_;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar5);
  pTVar7 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"hi Hello lo",&local_1a1);
  ctemplate::AssertExpandIs(pTVar7,local_a8,(string *)local_1a0,true);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  ctemplate::TemplateString::TemplateString(&local_1c8,"VAR");
  ctemplate::TemplateString::TemplateString(&local_1e8,&kLateDefine);
  TVar3.length_ = local_1c8.length_;
  TVar3.ptr_ = local_1c8.ptr_;
  TVar3.is_immutable_ = local_1c8.is_immutable_;
  TVar3._17_7_ = local_1c8._17_7_;
  TVar3.id_ = local_1c8.id_;
  TVar6.length_ = local_1e8.length_;
  TVar6.ptr_ = local_1e8.ptr_;
  TVar6.is_immutable_ = local_1e8.is_immutable_;
  TVar6._17_7_ = local_1e8._17_7_;
  TVar6.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar6);
  pTVar7 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"hi laterz lo",&local_209);
  ctemplate::AssertExpandIs(pTVar7,local_a8,(string *)local_208,true);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  if (local_18 != (Template *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_a8);
  return;
}

Assistant:

DynamicInitializationTemplateExpander() {
    Template* tpl = Template::StringToTemplate("hi {{VAR}} lo",
                                               STRIP_WHITESPACE);
    TemplateDictionary dict("dict");
    dict.SetValue("VAR", TemplateString("short-lived", strlen("short")));
    AssertExpandIs(tpl, &dict, "hi short lo", true);
    dict.SetValue("VAR", kHello);
    AssertExpandIs(tpl, &dict, "hi Hello lo", true);
    dict.SetValue("VAR", kLateDefine);
    AssertExpandIs(tpl, &dict, "hi laterz lo", true);
    delete tpl;
  }